

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_complete(char *zSql)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  
  bVar3 = 0;
LAB_00125833:
  bVar1 = *zSql;
  if (bVar1 < 0x27) {
    if (bVar1 < 0xc) {
      if (bVar1 - 9 < 2) goto LAB_00125919;
      if (bVar1 == 0) {
LAB_00125d87:
        bVar13 = bVar3 == 1;
        goto LAB_00125d8c;
      }
    }
    else {
      if ((bVar1 - 0xc < 2) || (bVar1 == 0x20)) {
LAB_00125919:
        lVar11 = 1;
        goto LAB_0012591c;
      }
      if (bVar1 == 0x22) goto LAB_001258ed;
    }
LAB_0012595e:
    if ((""[bVar1] & 0x46) == 0) {
LAB_00125a48:
      lVar11 = 2;
    }
    else {
      lVar5 = 0;
      lVar7 = -0x100000000;
      do {
        lVar7 = lVar7 + 0x100000000;
        lVar11 = lVar5 + 1;
        lVar5 = lVar5 + 1;
      } while ((""[((byte *)zSql)[lVar11]] & 0x46) != 0);
      lVar11 = 2;
      uVar8 = (ulong)(bVar1 - 0x43);
      if (0x31 < bVar1 - 0x43) goto LAB_00125d77;
      if ((0x100000001U >> (uVar8 & 0x3f) & 1) == 0) {
        iVar4 = (int)lVar5;
        pbVar6 = (byte *)zSql;
        if ((0x400000004U >> (uVar8 & 0x3f) & 1) != 0) {
          if (iVar4 == 7) {
LAB_00125ba9:
            lVar5 = 7;
            pcVar12 = "explain";
            lVar11 = 0;
            do {
              if ((ulong)*pbVar6 == 0) {
                pcVar12 = "explain" + lVar11;
                goto LAB_00125c03;
              }
              if (""[*pbVar6] != ""[(byte)*pcVar12]) goto LAB_00125c03;
              pbVar6 = pbVar6 + 1;
              lVar11 = lVar11 + 1;
              pcVar12 = (char *)((byte *)pcVar12 + 1);
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            lVar5 = 0;
            pcVar12 = "";
            pbVar6 = (byte *)zSql + 7;
LAB_00125c03:
            iVar4 = (int)lVar5;
            lVar11 = 3;
LAB_00125d47:
            if ((iVar4 < 1) || (""[*pbVar6] == ""[(byte)*pcVar12])) goto LAB_00125d77;
          }
          else if (iVar4 == 3) {
            lVar10 = 3;
            pcVar12 = "end";
            lVar11 = 0;
            pbVar9 = (byte *)zSql;
            do {
              if ((ulong)*pbVar9 == 0) {
                pcVar12 = "end" + lVar11;
                goto LAB_00125b72;
              }
              if (""[*pbVar9] != ""[(byte)*pcVar12]) goto LAB_00125b72;
              pbVar9 = pbVar9 + 1;
              lVar11 = lVar11 + 1;
              pcVar12 = (char *)((byte *)pcVar12 + 1);
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            lVar10 = 0;
            pcVar12 = "";
            pbVar9 = (byte *)zSql + 3;
LAB_00125b72:
            lVar11 = 7;
            if (((int)lVar10 < 1) || (""[*pbVar9] == ""[(byte)*pcVar12])) goto LAB_00125d77;
            if (lVar5 == 7) goto LAB_00125ba9;
          }
          goto LAB_00125d68;
        }
        if ((0x2000000020000U >> (uVar8 & 0x3f) & 1) != 0) {
          if (iVar4 == 4) {
            lVar10 = 4;
            pcVar12 = "temp";
            lVar11 = 0;
            pbVar9 = (byte *)zSql;
            do {
              if ((ulong)*pbVar9 == 0) {
                pcVar12 = "temp" + lVar11;
                goto LAB_00125cb8;
              }
              if (""[*pbVar9] != ""[(byte)*pcVar12]) goto LAB_00125cb8;
              pbVar9 = pbVar9 + 1;
              lVar11 = lVar11 + 1;
              pcVar12 = (char *)((byte *)pcVar12 + 1);
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            lVar10 = 0;
            pcVar12 = "";
            pbVar9 = (byte *)zSql + 4;
LAB_00125cb8:
            lVar11 = 5;
            if (((int)lVar10 < 1) || (""[*pbVar9] == ""[(byte)*pcVar12])) goto LAB_00125d77;
            if (lVar5 == 9) goto LAB_00125ceb;
          }
          else {
            if (iVar4 == 9) {
LAB_00125ceb:
              lVar5 = 9;
              pcVar12 = "temporary";
              lVar11 = 0;
              do {
                if ((ulong)*pbVar6 == 0) {
                  pcVar12 = "temporary" + lVar11;
                  goto LAB_00125d44;
                }
                if (""[*pbVar6] != ""[(byte)*pcVar12]) goto LAB_00125d44;
                pbVar6 = pbVar6 + 1;
                lVar11 = lVar11 + 1;
                pcVar12 = (char *)((byte *)pcVar12 + 1);
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
              lVar5 = 0;
              pcVar12 = "";
              pbVar6 = (byte *)zSql + 9;
LAB_00125d44:
              iVar4 = (int)lVar5;
              lVar11 = 5;
              goto LAB_00125d47;
            }
            if (iVar4 == 7) {
              lVar5 = 7;
              pbVar9 = (byte *)0x1811c6;
              lVar11 = 0;
              do {
                if ((ulong)*pbVar6 == 0) {
                  pbVar9 = (byte *)("sqlite_rename_trigger" + lVar11 + 0xe);
                  goto LAB_00125c18;
                }
                if (""[*pbVar6] != ""[*pbVar9]) goto LAB_00125c18;
                pbVar6 = pbVar6 + 1;
                lVar11 = lVar11 + 1;
                pbVar9 = pbVar9 + 1;
                lVar5 = lVar5 + -1;
              } while (lVar5 != 0);
              lVar5 = 0;
              pbVar9 = (byte *)0x1811cd;
              pbVar6 = (byte *)zSql + 7;
LAB_00125c18:
              lVar11 = 6;
              if (((int)lVar5 < 1) || (""[*pbVar6] == ""[*pbVar9])) goto LAB_00125d77;
            }
          }
          goto LAB_00125d68;
        }
      }
      else {
        if (lVar5 == 6) {
          lVar5 = 6;
          pcVar12 = "create";
          lVar11 = 0;
          pbVar6 = (byte *)zSql;
          do {
            if ((ulong)*pbVar6 == 0) {
              pcVar12 = "create" + lVar11;
              goto LAB_00125b3d;
            }
            if (""[*pbVar6] != ""[(byte)*pcVar12]) goto LAB_00125b3d;
            pbVar6 = pbVar6 + 1;
            lVar11 = lVar11 + 1;
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
          lVar5 = 0;
          pcVar12 = "";
          pbVar6 = (byte *)zSql + 6;
LAB_00125b3d:
          lVar11 = 4;
          if (((int)lVar5 < 1) || (""[*pbVar6] == ""[(byte)*pcVar12])) goto LAB_00125d77;
        }
LAB_00125d68:
        lVar11 = 2;
      }
LAB_00125d77:
      zSql = (char *)((byte *)zSql + (lVar7 >> 0x20));
    }
  }
  else if (bVar1 < 0x3b) {
    if (bVar1 == 0x27) {
LAB_001258ed:
      do {
        bVar2 = ((byte *)zSql)[1];
        zSql = (char *)((byte *)zSql + 1);
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      if (bVar2 != 0) {
        lVar11 = 2;
        goto LAB_0012591c;
      }
LAB_00125d83:
      bVar13 = false;
LAB_00125d8c:
      return (int)bVar13;
    }
    if (bVar1 == 0x2d) {
      lVar11 = 2;
      if (((byte *)zSql)[1] == 0x2d) {
        while( true ) {
          if (*zSql == 0) goto LAB_00125d87;
          if (*zSql == 10) break;
          zSql = (char *)((byte *)zSql + 1);
        }
        goto LAB_00125919;
      }
    }
    else {
      if (bVar1 != 0x2f) goto LAB_0012595e;
      lVar11 = 2;
      if (((byte *)zSql)[1] == 0x2a) {
        zSql = (char *)((byte *)zSql + 3);
        do {
          if (((byte *)zSql)[-1] == 0x2a) {
            if (*zSql == 0x2f) goto LAB_00125a50;
          }
          else if (((byte *)zSql)[-1] == 0) goto LAB_00125d83;
          zSql = (char *)((byte *)zSql + 1);
        } while( true );
      }
    }
  }
  else {
    if (bVar1 != 0x3b) {
      if (bVar1 == 0x60) goto LAB_001258ed;
      if (bVar1 != 0x5b) goto LAB_0012595e;
      do {
        pbVar6 = (byte *)zSql + 1;
        if (*pbVar6 == 0) goto LAB_00125d83;
        zSql = (char *)((byte *)zSql + 1);
      } while (*pbVar6 != 0x5d);
      goto LAB_00125a48;
    }
    lVar11 = 0;
  }
LAB_0012591c:
  bVar3 = sqlite3_complete::trans[bVar3][lVar11];
  zSql = (char *)((byte *)zSql + 1);
  goto LAB_00125833;
LAB_00125a50:
  lVar11 = 1;
  goto LAB_0012591c;
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simplier
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}